

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O0

int osfmode(char *fname,int follow_links,unsigned_long *mode,unsigned_long *attr)

{
  int iVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  int ok;
  os_file_stat_t s;
  os_file_stat_t *in_stack_00000088;
  int in_stack_00000094;
  char *in_stack_00000098;
  undefined8 local_30;
  undefined8 local_28;
  
  iVar1 = os_file_stat(in_stack_00000098,in_stack_00000094,in_stack_00000088);
  if (iVar1 != 0) {
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = local_30;
    }
    if (in_RCX != (undefined8 *)0x0) {
      *in_RCX = local_28;
    }
  }
  return iVar1;
}

Assistant:

int
osfmode( const char *fname, int follow_links, unsigned long *mode,
         unsigned long* attr )
{
    os_file_stat_t s;
    int ok;
    if ((ok = os_file_stat(fname, follow_links, &s)) != false) {
        if (mode != NULL)
            *mode = s.mode;
        if (attr != NULL)
            *attr = s.attrs;
    }
    return ok;
}